

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev1.c
# Opt level: O0

LispPTR N_OP_getbitsnfd(int base_addr,int word_offset,int beta)

{
  ushort uVar1;
  DLword *pDVar2;
  short size;
  short first;
  DLword *pword;
  int beta_local;
  int word_offset_local;
  int base_addr_local;
  
  pDVar2 = NativeAligned2FromLAddr(base_addr + word_offset);
  uVar1 = (ushort)beta & 0xf;
  return (int)(uint)*(ushort *)((ulong)pDVar2 ^ 2) >>
         (0x10U - ((char)(beta >> 4) + (char)uVar1 + '\x01') & 0x1f) & mask_array[(short)uVar1] |
         0xe0000;
}

Assistant:

LispPTR N_OP_getbitsnfd(int base_addr, int word_offset, int beta) {
  DLword *pword;
  short first;
  short size;

  pword = NativeAligned2FromLAddr(base_addr + word_offset);
  size = 0xF & beta;
  first = beta >> 4;

#ifdef CHECK
  if (base_addr > POINTERMASK) { error("getbits: base out of range"); }
  if (first + size > 15) { error("getbits beta too big"); }
#endif

  return (S_POSITIVE | ((GETWORD(pword) >> (16 - (first + size + 1))) & mask_array[size]));
}